

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<char,_false,_6>_> __thiscall
immutable::rrb_details::rrb_drop_left<char,false,6>
          (rrb_details *this,ref<immutable::rrb<char,_false,_6>_> *in,uint32_t left)

{
  uint32_t uVar1;
  rrb<char,_false,_6> *prVar2;
  leaf_node<char,_false> *plVar3;
  tree_node<char,_false> *ptVar4;
  uint32_t i;
  rrb<char,_false,_6> *prVar5;
  undefined8 *puVar6;
  uint *puVar7;
  ref<immutable::rrb<char,_false,_6>_> rVar8;
  long lVar9;
  uint32_t i_1;
  ulong uVar10;
  ulong uVar11;
  char *__function;
  uint uVar12;
  uint uVar13;
  uint32_t uVar14;
  ref<immutable::rrb<char,_false,_6>_> new_rrb;
  ref<immutable::rrb<char,_false,_6>_> local_58;
  ref<immutable::rrb<char,_false,_6>_> local_50;
  rrb<char,_false,_6> *local_48;
  uint32_t local_3c;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_38;
  
  prVar5 = in->ptr;
  if (prVar5 != (rrb<char,_false,_6> *)0x0) {
    uVar13 = prVar5->cnt;
    uVar12 = uVar13 - left;
    if (uVar13 < left || uVar12 == 0) {
      puVar6 = (undefined8 *)malloc(0x28);
      *puVar6 = 0;
      *(undefined4 *)(puVar6 + 1) = 0;
      puVar6[2] = 0;
      puVar6[3] = 0;
      local_50.ptr = (rrb<char,_false,_6> *)malloc(0x18);
      ((local_50.ptr)->tail).ptr = (leaf_node<char,_false> *)0x0;
      (local_50.ptr)->cnt = 0;
      (local_50.ptr)->shift = 0;
      *(undefined8 *)&(local_50.ptr)->tail_len = 1;
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar6 + 2),
                 (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_50);
      if ((local_50.ptr != (rrb<char,_false,_6> *)0x0) &&
         (uVar1 = (local_50.ptr)->tail_len, (local_50.ptr)->tail_len = uVar1 - 1, uVar1 == 1)) {
        free(local_50.ptr);
      }
      *(undefined8 **)this = puVar6;
      *(undefined4 *)(puVar6 + 4) = 1;
      return (ref<immutable::rrb<char,_false,_6>_>)(rrb<char,_false,_6> *)this;
    }
    if (left == 0) {
LAB_0014ff98:
      if ((prVar5->shift != 0) ||
         (ptVar4 = (prVar5->root).ptr, ptVar4 == (tree_node<char,_false> *)0x0)) {
LAB_0014ffa0:
        prVar5 = in->ptr;
        *(rrb<char,_false,_6> **)this = prVar5;
        if (prVar5 != (rrb<char,_false,_6> *)0x0) {
          prVar5->_ref_count = prVar5->_ref_count + 1;
        }
        return (ref<immutable::rrb<char,_false,_6>_>)(rrb<char,_false,_6> *)this;
      }
      uVar13 = prVar5->cnt;
      uVar11 = (ulong)uVar13;
      if (uVar11 < 0x41) {
        local_58.ptr = (rrb<char,_false,_6> *)malloc(uVar11 + 0x18);
        (local_58.ptr)->shift = uVar13;
        (local_58.ptr)->cnt = 0;
        ((local_58.ptr)->tail).ptr = (leaf_node<char,_false> *)&(local_58.ptr)->root;
        *(undefined4 *)&(local_58.ptr)->field_0xc = 0;
        if (uVar13 == 0) {
          (local_58.ptr)->tail_len = 1;
        }
        else {
          uVar10 = 0;
          do {
            *(undefined1 *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar10) = 0;
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
          prVar5 = in->ptr;
          (local_58.ptr)->tail_len = 1;
          if (prVar5 == (rrb<char,_false,_6> *)0x0) goto LAB_001502ce;
        }
        uVar11 = 0;
        do {
          ptVar4 = (prVar5->root).ptr;
          if (ptVar4 == (tree_node<char,_false> *)0x0) goto LAB_00150371;
          if (ptVar4->len <= uVar11) {
            uVar11 = 0;
            goto LAB_00150125;
          }
          *(undefined1 *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar11) =
               *(undefined1 *)(*(long *)(ptVar4 + 1) + uVar11);
          uVar11 = uVar11 + 1;
          prVar5 = in->ptr;
        } while (prVar5 != (rrb<char,_false,_6> *)0x0);
      }
      else {
        if (0x3f < uVar13 - prVar5->tail_len) goto LAB_0014ffa0;
        uVar1 = ptVar4->len;
        rVar8.ptr = (rrb<char,_false,_6> *)malloc(0x58);
        (rVar8.ptr)->cnt = 0;
        (rVar8.ptr)->shift = 0x40;
        ((rVar8.ptr)->tail).ptr = (leaf_node<char,_false> *)&(rVar8.ptr)->root;
        *(undefined4 *)&(rVar8.ptr)->field_0xc = 0;
        lVar9 = 0;
        do {
          *(undefined1 *)((long)&(((rVar8.ptr)->tail).ptr)->type + lVar9) = 0;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x40);
        (rVar8.ptr)->tail_len = 1;
        prVar5 = in->ptr;
        local_48 = (rrb<char,_false,_6> *)this;
        if (prVar5 != (rrb<char,_false,_6> *)0x0) {
          uVar13 = 0x40 - uVar1;
          uVar14 = prVar5->tail_len;
          uVar11 = (ulong)(uVar14 - uVar13);
          local_3c = uVar1;
          local_58.ptr = (rrb<char,_false,_6> *)malloc(uVar11 + 0x18);
          this = (rrb_details *)local_48;
          uVar14 = uVar14 - uVar13;
          (local_58.ptr)->shift = uVar14;
          (local_58.ptr)->cnt = 0;
          ((local_58.ptr)->tail).ptr = (leaf_node<char,_false> *)&(local_58.ptr)->root;
          *(undefined4 *)&(local_58.ptr)->field_0xc = 0;
          if (uVar14 == 0) {
            (local_58.ptr)->tail_len = 1;
          }
          else {
            uVar10 = 0;
            do {
              *(undefined1 *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar10) = 0;
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
            prVar5 = in->ptr;
            (local_58.ptr)->tail_len = 1;
            if (prVar5 == (rrb<char,_false,_6> *)0x0) goto LAB_001502ce;
          }
          uVar11 = 0;
          do {
            ptVar4 = (prVar5->root).ptr;
            if (ptVar4 == (tree_node<char,_false> *)0x0) goto LAB_00150371;
            if (ptVar4->len <= uVar11) {
              if (local_3c == 0x40) goto LAB_00150294;
              uVar11 = 0;
              goto LAB_0015024d;
            }
            *(undefined1 *)((long)&(((rVar8.ptr)->tail).ptr)->type + uVar11) =
                 *(undefined1 *)(*(long *)(ptVar4 + 1) + uVar11);
            uVar11 = uVar11 + 1;
            prVar5 = in->ptr;
          } while (prVar5 != (rrb<char,_false,_6> *)0x0);
        }
      }
    }
    else {
      local_48 = (rrb<char,_false,_6> *)this;
      if (prVar5->tail_len < uVar12) {
        prVar5 = (rrb<char,_false,_6> *)malloc(0x28);
        prVar5->cnt = 0;
        prVar5->shift = 0;
        prVar5->tail_len = 0;
        (prVar5->tail).ptr = (leaf_node<char,_false> *)0x0;
        (prVar5->root).ptr = (tree_node<char,_false> *)0x0;
        local_50.ptr = (rrb<char,_false,_6> *)malloc(0x18);
        ((local_50.ptr)->tail).ptr = (leaf_node<char,_false> *)0x0;
        (local_50.ptr)->cnt = 0;
        (local_50.ptr)->shift = 0;
        *(undefined8 *)&(local_50.ptr)->tail_len = 1;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  (&prVar5->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_50);
        if ((local_50.ptr != (rrb<char,_false,_6> *)0x0) &&
           (uVar1 = (local_50.ptr)->tail_len, (local_50.ptr)->tail_len = uVar1 - 1, uVar1 == 1)) {
          free(local_50.ptr);
        }
        this = (rrb_details *)local_48;
        prVar5->_ref_count = 1;
        prVar2 = in->ptr;
        local_58.ptr = prVar5;
        if (prVar2 != (rrb<char,_false,_6> *)0x0) {
          rrb_drop_left_rec<char,false,6>
                    ((rrb_details *)&local_50,&prVar5->shift,&prVar2->root,left,prVar2->shift,false)
          ;
          rVar8.ptr = local_50.ptr;
          if (local_50.ptr != (rrb<char,_false,_6> *)0x0) {
            (local_50.ptr)->tail_len = (local_50.ptr)->tail_len + 1;
          }
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
          if (local_58.ptr != (rrb<char,_false,_6> *)0x0) {
            (local_58.ptr)->cnt = uVar12;
            if (rVar8.ptr != (rrb<char,_false,_6> *)0x0) {
              (rVar8.ptr)->tail_len = (rVar8.ptr)->tail_len + 1;
            }
            local_50.ptr = (rrb<char,_false,_6> *)((local_58.ptr)->root).ptr;
            ((local_58.ptr)->root).ptr = (tree_node<char,_false> *)rVar8.ptr;
            ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                      ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
            if (local_58.ptr != (rrb<char,_false,_6> *)0x0) {
              if ((local_58.ptr)->shift == 0) {
                prVar5 = in->ptr;
LAB_0014ff34:
                if (prVar5 == (rrb<char,_false,_6> *)0x0) goto LAB_001502ce;
              }
              else {
                if (rVar8.ptr == (rrb<char,_false,_6> *)0x0) {
                  __function = 
                  "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
                  ;
                  goto LAB_00150386;
                }
                plVar3 = ((rVar8.ptr)->tail).ptr;
                prVar5 = in->ptr;
                if (plVar3 == (leaf_node<char,_false> *)0x0) goto LAB_0014ff34;
                if (prVar5 == (rrb<char,_false,_6> *)0x0) goto LAB_001502ce;
                *(uint32_t *)(*(long *)plVar3 + (ulong)((rVar8.ptr)->shift - 1) * 4) =
                     (local_58.ptr)->cnt - prVar5->tail_len;
              }
              ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                        (&(local_58.ptr)->tail,&prVar5->tail);
              prVar5 = in->ptr;
              if ((prVar5 != (rrb<char,_false,_6> *)0x0) &&
                 (local_58.ptr != (rrb<char,_false,_6> *)0x0)) {
                (local_58.ptr)->tail_len = prVar5->tail_len;
                (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
                in->ptr = (rrb<char,_false,_6> *)local_58;
                local_50.ptr = prVar5;
                ref<immutable::rrb<char,_false,_6>_>::~ref(&local_50);
                release<char>((internal_node<char,_false> *)rVar8.ptr);
                ref<immutable::rrb<char,_false,_6>_>::~ref(&local_58);
                prVar5 = in->ptr;
                if (prVar5 != (rrb<char,_false,_6> *)0x0) goto LAB_0014ff98;
              }
            }
          }
        }
      }
      else {
        uVar10 = (ulong)uVar12;
        local_58.ptr = (rrb<char,_false,_6> *)malloc(uVar10 + 0x18);
        (local_58.ptr)->shift = uVar12;
        uVar11 = 0;
        (local_58.ptr)->cnt = 0;
        ((local_58.ptr)->tail).ptr = (leaf_node<char,_false> *)&(local_58.ptr)->root;
        *(undefined4 *)&(local_58.ptr)->field_0xc = 0;
        do {
          *(undefined1 *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar11) = 0;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
        (local_58.ptr)->tail_len = 1;
        uVar11 = 0;
        while (prVar5 = in->ptr, prVar5 != (rrb<char,_false,_6> *)0x0) {
          plVar3 = (prVar5->tail).ptr;
          if (plVar3 == (leaf_node<char,_false> *)0x0) goto LAB_0015035a;
          *(char *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar11) =
               plVar3->child[(left - uVar13) + (int)uVar11 + prVar5->tail_len];
          uVar11 = uVar11 + 1;
          if (uVar10 == uVar11) {
            puVar7 = (uint *)malloc(0x28);
            puVar7[0] = 0;
            puVar7[1] = 0;
            puVar7[2] = 0;
            puVar7[4] = 0;
            puVar7[5] = 0;
            puVar7[6] = 0;
            puVar7[7] = 0;
            local_50.ptr = (rrb<char,_false,_6> *)malloc(0x18);
            ((local_50.ptr)->tail).ptr = (leaf_node<char,_false> *)0x0;
            (local_50.ptr)->cnt = 0;
            (local_50.ptr)->shift = 0;
            *(undefined8 *)&(local_50.ptr)->tail_len = 1;
            ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                      ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar7 + 4),
                       (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_50);
            prVar5 = local_48;
            if ((local_50.ptr != (rrb<char,_false,_6> *)0x0) &&
               (uVar1 = (local_50.ptr)->tail_len, (local_50.ptr)->tail_len = uVar1 - 1, uVar1 == 1))
            {
              free(local_50.ptr);
            }
            *(uint **)prVar5 = puVar7;
            puVar7[8] = 1;
            *puVar7 = uVar12;
            puVar7[2] = uVar12;
            ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                      ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar7 + 4),
                       (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58);
            if (local_58.ptr == (rrb<char,_false,_6> *)0x0) {
              return (ref<immutable::rrb<char,_false,_6>_>)prVar5;
            }
            uVar1 = (local_58.ptr)->tail_len;
            (local_58.ptr)->tail_len = uVar1 - 1;
            if (uVar1 != 1) {
              return (ref<immutable::rrb<char,_false,_6>_>)prVar5;
            }
            free(local_58.ptr);
            return (ref<immutable::rrb<char,_false,_6>_>)prVar5;
          }
        }
      }
    }
  }
  goto LAB_001502ce;
  while( true ) {
    plVar3 = (prVar5->tail).ptr;
    if (plVar3 == (leaf_node<char,_false> *)0x0) goto LAB_0015035a;
    ptVar4 = (prVar5->root).ptr;
    if (ptVar4 == (tree_node<char,_false> *)0x0) goto LAB_00150371;
    *(char *)((long)&(((rVar8.ptr)->tail).ptr)->type + (ulong)(ptVar4->len + (int)uVar11)) =
         plVar3->child[uVar11];
    uVar11 = uVar11 + 1;
    if (uVar13 == uVar11) break;
LAB_0015024d:
    prVar5 = in->ptr;
    if (prVar5 == (rrb<char,_false,_6> *)0x0) goto LAB_001502ce;
  }
  prVar5 = in->ptr;
  if (prVar5 != (rrb<char,_false,_6> *)0x0) {
LAB_00150294:
    uVar11 = 0;
    do {
      uVar12 = prVar5->tail_len - uVar13;
      if (uVar12 <= uVar11) {
        prVar5->tail_len = uVar12;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  (&prVar5->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58);
        prVar5 = in->ptr;
        if (prVar5 != (rrb<char,_false,_6> *)0x0) {
          (rVar8.ptr)->tail_len = (rVar8.ptr)->tail_len + 1;
          local_50.ptr = (rrb<char,_false,_6> *)(prVar5->root).ptr;
          (prVar5->root).ptr = (tree_node<char,_false> *)rVar8.ptr;
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
          if ((local_58.ptr != (rrb<char,_false,_6> *)0x0) &&
             (uVar1 = (local_58.ptr)->tail_len, (local_58.ptr)->tail_len = uVar1 - 1, uVar1 == 1)) {
            free(local_58.ptr);
          }
          uVar1 = (rVar8.ptr)->tail_len;
          (rVar8.ptr)->tail_len = uVar1 - 1;
          goto joined_r0x00150347;
        }
        break;
      }
      plVar3 = (prVar5->tail).ptr;
      if (plVar3 == (leaf_node<char,_false> *)0x0) goto LAB_0015035a;
      *(char *)((long)&(((local_58.ptr)->tail).ptr)->type + uVar11) =
           plVar3->child[uVar13 + (int)uVar11];
      uVar11 = uVar11 + 1;
      prVar5 = in->ptr;
    } while (prVar5 != (rrb<char,_false,_6> *)0x0);
  }
  goto LAB_001502ce;
LAB_0015035a:
  __function = 
  "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
  ;
  goto LAB_00150386;
LAB_00150371:
  __function = 
  "T *immutable::ref<immutable::rrb_details::tree_node<char, false>>::operator->() const [T = immutable::rrb_details::tree_node<char, false>]"
  ;
  goto LAB_00150386;
  while( true ) {
    plVar3 = (prVar5->tail).ptr;
    if (plVar3 == (leaf_node<char,_false> *)0x0) goto LAB_0015035a;
    ptVar4 = (prVar5->root).ptr;
    if (ptVar4 == (tree_node<char,_false> *)0x0) goto LAB_00150371;
    *(char *)((long)&(((local_58.ptr)->tail).ptr)->type + (ulong)(ptVar4->len + (int)uVar11)) =
         plVar3->child[uVar11];
    uVar11 = uVar11 + 1;
    prVar5 = in->ptr;
    if (prVar5 == (rrb<char,_false,_6> *)0x0) break;
LAB_00150125:
    if (prVar5->tail_len <= uVar11) {
      prVar5->tail_len = prVar5->cnt;
      local_38.ptr = (tree_node<char,_false> *)0x0;
      local_50.ptr = (rrb<char,_false,_6> *)(prVar5->root).ptr;
      (prVar5->root).ptr = (tree_node<char,_false> *)0x0;
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_50);
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_38);
      if (in->ptr != (rrb<char,_false,_6> *)0x0) {
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  (&in->ptr->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_58)
        ;
        if (local_58.ptr != (rrb<char,_false,_6> *)0x0) {
          uVar1 = (local_58.ptr)->tail_len;
          (local_58.ptr)->tail_len = uVar1 - 1;
          rVar8.ptr = local_58.ptr;
joined_r0x00150347:
          if (uVar1 == 1) {
            free(rVar8.ptr);
          }
        }
        goto LAB_0014ffa0;
      }
      break;
    }
  }
LAB_001502ce:
  __function = 
  "T *immutable::ref<immutable::rrb<char, false, 6>>::operator->() const [T = immutable::rrb<char, false, 6>]"
  ;
LAB_00150386:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }